

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.h
# Opt level: O0

QList<QSizeGrip_*> * __thiscall
QObject::findChildren<QSizeGrip*>(QObject *this,QAnyStringView aName,FindChildOptions options)

{
  long lVar1;
  QMetaObject *in_RCX;
  QAnyStringView *in_RDX;
  QObject *in_RSI;
  QList<QSizeGrip_*> *in_RDI;
  long in_FS_OFFSET;
  QList<QSizeGrip_*> *list;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (QSizeGrip **)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QList<QSizeGrip_*>::QList((QList<QSizeGrip_*> *)0x63e1ef);
  qt_qFindChildren_helper
            (in_RSI,in_RDX,in_RCX,(QList_conflict2 *)&QSizeGrip::staticMetaObject,
             (QFlags_conflict1 *)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<T> findChildren(QAnyStringView aName, Qt::FindChildOptions options = Qt::FindChildrenRecursively) const
    {
        typedef typename std::remove_cv<typename std::remove_pointer<T>::type>::type ObjType;
        static_assert(QtPrivate::HasQ_OBJECT_Macro<ObjType>::Value,
                          "No Q_OBJECT in the class passed to QObject::findChildren");
        QList<T> list;
        qt_qFindChildren_helper(this, aName, ObjType::staticMetaObject,
                                reinterpret_cast<QList<void *> *>(&list), options);
        return list;
    }